

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

void __thiscall Server::handNewConn(Server *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar1;
  pointer this_01;
  HttpData *this_02;
  element_type *peVar2;
  code *local_c0;
  undefined8 local_b8;
  type local_b0;
  Functor local_90;
  shared_ptr<HttpData> local_70;
  undefined1 local_60 [32];
  undefined1 local_40 [8];
  shared_ptr<HttpData> req_info;
  EventLoop *loop;
  int accept_fd;
  socklen_t client_addr_len;
  sockaddr_in client_addr;
  Server *this_local;
  
  client_addr.sin_zero = (uchar  [8])this;
  memset(&accept_fd,0,0x10);
  loop._4_4_ = 0x10;
  loop._0_4_ = 0;
  while( true ) {
    while( true ) {
      loop._0_4_ = accept(this->listenFd_,(sockaddr *)&accept_fd,(socklen_t *)((long)&loop + 4));
      if ((int)loop < 1) {
        peVar2 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->acceptChannel_);
        Channel::setEvents(peVar2,0x80000001);
        return;
      }
      this_01 = std::unique_ptr<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>::
                operator->(&this->eventLoopThreadPool_);
      req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)EventLoopThreadPool::getNextLoop(this_01)
      ;
      if ((int)loop < 100000) break;
      close((int)loop);
    }
    iVar1 = setSocketNonBlocking((int)loop);
    if (iVar1 < 0) break;
    setSocketNodelay((int)loop);
    this_02 = (HttpData *)operator_new(0x2c0);
    HttpData::HttpData(this_02,(EventLoop *)
                               req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,(int)loop);
    std::shared_ptr<HttpData>::shared_ptr<HttpData,void>((shared_ptr<HttpData> *)local_40,this_02);
    std::__shared_ptr_access<HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_40);
    HttpData::getChannel((HttpData *)local_60);
    peVar2 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_60);
    std::shared_ptr<HttpData>::shared_ptr(&local_70,(shared_ptr<HttpData> *)local_40);
    Channel::setHolder(peVar2,&local_70);
    std::shared_ptr<HttpData>::~shared_ptr(&local_70);
    std::shared_ptr<Channel>::~shared_ptr((shared_ptr<Channel> *)local_60);
    this_00 = req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_c0 = HttpData::newEvent;
    local_b8 = 0;
    std::bind<void(HttpData::*)(),std::shared_ptr<HttpData>&>
              (&local_b0,(offset_in_HttpData_to_subr *)&local_c0,(shared_ptr<HttpData> *)local_40);
    std::function<void()>::function<std::_Bind<void(HttpData::*(std::shared_ptr<HttpData>))()>,void>
              ((function<void()> *)&local_90,&local_b0);
    EventLoop::queueInLoop((EventLoop *)this_00._M_pi,&local_90);
    std::function<void_()>::~function(&local_90);
    std::_Bind<void_(HttpData::*(std::shared_ptr<HttpData>))()>::~_Bind(&local_b0);
    std::shared_ptr<HttpData>::~shared_ptr((shared_ptr<HttpData> *)local_40);
  }
  return;
}

Assistant:

void Server::handNewConn() {
  struct sockaddr_in client_addr;
  memset(&client_addr, 0, sizeof(struct sockaddr_in));
  socklen_t client_addr_len = sizeof(client_addr);
  int accept_fd = 0;
  while ((accept_fd = accept(listenFd_, (struct sockaddr *)&client_addr,
                             &client_addr_len)) > 0) {
    EventLoop *loop = eventLoopThreadPool_->getNextLoop();
    //LOG << "New connection from " << inet_ntoa(client_addr.sin_addr) << ":"
    //    << ntohs(client_addr.sin_port) << " fd : " << accept_fd;
    // cout << "new connection" << endl;
    // cout << inet_ntoa(client_addr.sin_addr) << endl;
    // cout << ntohs(client_addr.sin_port) << endl;
    /*
    // TCP的保活机制默认是关闭的
    int optval = 0;
    socklen_t len_optval = 4;
    getsockopt(accept_fd, SOL_SOCKET,  SO_KEEPALIVE, &optval, &len_optval);
    cout << "optval ==" << optval << endl;
    */
    // 限制服务器的最大并发连接数
    if (accept_fd >= MAXFDS) {
      close(accept_fd);
      continue;
    }
    // 设为非阻塞模式
    if (setSocketNonBlocking(accept_fd) < 0) {
      //LOG << "Set non block failed!";
      // perror("Set non block failed!");
      return;
    }

    setSocketNodelay(accept_fd);
    // setSocketNoLinger(accept_fd);

    shared_ptr<HttpData> req_info(new HttpData(loop, accept_fd));
    req_info->getChannel()->setHolder(req_info);
    loop->queueInLoop(std::bind(&HttpData::newEvent, req_info));
  }
  acceptChannel_->setEvents(EPOLLIN | EPOLLET);
}